

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

void tcg_opt_gen_movi(TCGContext_conflict9 *s,TCGOp *op,TCGArg dst,TCGArg val)

{
  tcg_temp_info *ptVar1;
  tcg_temp_info *di;
  tcg_target_ulong mask;
  TCGOpcode new_op;
  TCGOpDef *def;
  TCGArg val_local;
  TCGArg dst_local;
  TCGOp *op_local;
  TCGContext_conflict9 *s_local;
  
  ptVar1 = arg_info(dst);
  if ((s->tcg_op_defs[*(uint *)op & 0xff].flags & 0x40) == 0) {
    if ((s->tcg_op_defs[*(uint *)op & 0xff].flags & 0x10) == 0) {
      mask._4_4_ = 6;
    }
    else {
      mask._4_4_ = 0x40;
    }
  }
  else {
    mask._4_4_ = 0x8a;
  }
  *(uint *)op = *(uint *)op & 0xffffff00 | mask._4_4_;
  op->args[0] = dst;
  op->args[1] = val;
  reset_temp(dst);
  ptVar1->is_const = true;
  ptVar1->val = val;
  di = (tcg_temp_info *)val;
  if (mask._4_4_ == 6) {
    di = (tcg_temp_info *)(val | 0xffffffff00000000);
  }
  ptVar1->mask = (tcg_target_ulong)di;
  return;
}

Assistant:

static void tcg_opt_gen_movi(TCGContext *s, TCGOp *op, TCGArg dst, TCGArg val)
{
    const TCGOpDef *def;
    TCGOpcode new_op;
    tcg_target_ulong mask;
    struct tcg_temp_info *di = arg_info(dst);

    def = &s->tcg_op_defs[op->opc];
    if (def->flags & TCG_OPF_VECTOR) {
        new_op = INDEX_op_dupi_vec;
    } else if (def->flags & TCG_OPF_64BIT) {
        new_op = INDEX_op_movi_i64;
    } else {
        new_op = INDEX_op_movi_i32;
    }
    op->opc = new_op;
    /* TCGOP_VECL and TCGOP_VECE remain unchanged.  */
    op->args[0] = dst;
    op->args[1] = val;

    reset_temp(dst);
    di->is_const = true;
    di->val = val;
    mask = val;
    if (TCG_TARGET_REG_BITS > 32 && new_op == INDEX_op_movi_i32) {
        /* High bits of the destination are now garbage.  */
        mask |= ~0xffffffffull;
    }
    di->mask = mask;
}